

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O3

unsigned_long bn_add_part_words(unsigned_long *r,unsigned_long *a,unsigned_long *b,int cl,int dl)

{
  unsigned_long uVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  
  uVar1 = bn_add_words(r,a,b,cl);
  if (dl != 0) {
    puVar3 = r + cl;
    if (dl < 0) {
      puVar4 = b + cl;
      if (uVar1 != 0) {
        lVar5 = 0;
        lVar7 = 0;
        do {
          uVar8 = dl + (int)lVar7;
          uVar2 = (ulong)CARRY8(uVar1,puVar4[lVar7]);
          puVar3[lVar7] = uVar1 + puVar4[lVar7];
          if (-2 < (int)uVar8) {
            return uVar2;
          }
          uVar6 = (ulong)CARRY8(uVar2,puVar4[lVar7 + 1]);
          puVar3[lVar7 + 1] = uVar2 + puVar4[lVar7 + 1];
          if (uVar8 == 0xfffffffe) {
            return uVar6;
          }
          uVar2 = (ulong)CARRY8(uVar6,puVar4[lVar7 + 2]);
          puVar3[lVar7 + 2] = uVar6 + puVar4[lVar7 + 2];
          if (0xfffffffc < uVar8) {
            return uVar2;
          }
          uVar6 = puVar4[lVar7 + 3] + uVar2;
          puVar3[lVar7 + 3] = uVar6;
          if (uVar8 == 0xfffffffc) {
            bVar9 = uVar6 < uVar2;
            goto LAB_00113e8e;
          }
          lVar7 = lVar7 + 4;
          lVar5 = lVar5 + -0x20;
          uVar1 = 1;
        } while (uVar6 < uVar2);
        dl = dl + (int)lVar7;
        puVar4 = (unsigned_long *)((long)puVar4 - lVar5);
        puVar3 = (unsigned_long *)((long)puVar3 - lVar5);
      }
      *puVar3 = *puVar4;
      if (dl != -1) {
        lVar5 = 0;
        do {
          uVar8 = dl + (int)lVar5;
          puVar3[lVar5 + 1] = puVar4[lVar5 + 1];
          if (uVar8 == 0xfffffffe) {
            return 0;
          }
          puVar3[lVar5 + 2] = puVar4[lVar5 + 2];
          if (0xfffffffc < uVar8) {
            return 0;
          }
          puVar3[lVar5 + 3] = puVar4[lVar5 + 3];
          if (uVar8 == 0xfffffffc) {
            return 0;
          }
          puVar3[lVar5 + 4] = puVar4[lVar5 + 4];
          lVar5 = lVar5 + 4;
        } while ((int)lVar5 + dl != -1);
        return 0;
      }
    }
    else {
      uVar8 = dl;
      if (uVar1 == 0) {
        puVar4 = a + cl;
      }
      else {
        do {
          uVar2 = (ulong)CARRY8(uVar1,a[cl]);
          r[cl] = uVar1 + a[cl];
          if ((int)uVar8 < 2) {
            return uVar2;
          }
          uVar6 = (ulong)CARRY8(uVar2,a[(long)cl + 1]);
          r[(long)cl + 1] = uVar2 + a[(long)cl + 1];
          if (uVar8 == 2) {
            return uVar6;
          }
          uVar2 = (ulong)CARRY8(uVar6,a[(long)cl + 2]);
          r[(long)cl + 2] = uVar6 + a[(long)cl + 2];
          dl = uVar8 - 4;
          if (uVar8 < 4) {
            return uVar2;
          }
          uVar6 = a[(long)cl + 3] + uVar2;
          r[(long)cl + 3] = uVar6;
          if (uVar8 == 4) {
            bVar9 = uVar6 < uVar2;
LAB_00113e8e:
            return (ulong)bVar9;
          }
          a = a + 4;
          r = r + 4;
          uVar1 = 1;
          uVar8 = dl;
        } while (uVar6 < uVar2);
        puVar4 = a + cl;
        puVar3 = r + cl;
      }
      *puVar3 = *puVar4;
      if (dl != 1) {
        lVar5 = 4;
        do {
          puVar3[lVar5 + -3] = puVar4[lVar5 + -3];
          if (dl == 2) {
            return 0;
          }
          puVar3[lVar5 + -2] = puVar4[lVar5 + -2];
          bVar9 = (uint)dl < 4;
          dl = dl - 4;
          if (bVar9) {
            return 0;
          }
          puVar3[lVar5 + -1] = puVar4[lVar5 + -1];
          if (dl == 0) {
            return 0;
          }
          puVar3[lVar5] = puVar4[lVar5];
          lVar5 = lVar5 + 4;
        } while (1 < (uint)dl);
        return 0;
      }
    }
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

BN_ULONG bn_add_part_words(BN_ULONG *r,
                           const BN_ULONG *a, const BN_ULONG *b,
                           int cl, int dl)
{
    BN_ULONG c, l, t;

    assert(cl >= 0);
    c = bn_add_words(r, a, b, cl);

    if (dl == 0)
        return c;

    r += cl;
    a += cl;
    b += cl;

    if (dl < 0) {
        int save_dl = dl;
        while (c) {
            l = (c + b[0]) & BN_MASK2;
            c = (l < c);
            r[0] = l;
            if (++dl >= 0)
                break;

            l = (c + b[1]) & BN_MASK2;
            c = (l < c);
            r[1] = l;
            if (++dl >= 0)
                break;

            l = (c + b[2]) & BN_MASK2;
            c = (l < c);
            r[2] = l;
            if (++dl >= 0)
                break;

            l = (c + b[3]) & BN_MASK2;
            c = (l < c);
            r[3] = l;
            if (++dl >= 0)
                break;

            save_dl = dl;
            b += 4;
            r += 4;
        }
        if (dl < 0) {
            if (save_dl < dl) {
                switch (dl - save_dl) {
                case 1:
                    r[1] = b[1];
                    if (++dl >= 0)
                        break;
                case 2:
                    r[2] = b[2];
                    if (++dl >= 0)
                        break;
                case 3:
                    r[3] = b[3];
                    if (++dl >= 0)
                        break;
                }
                b += 4;
                r += 4;
            }
        }
        if (dl < 0) {
            for (;;) {
                r[0] = b[0];
                if (++dl >= 0)
                    break;
                r[1] = b[1];
                if (++dl >= 0)
                    break;
                r[2] = b[2];
                if (++dl >= 0)
                    break;
                r[3] = b[3];
                if (++dl >= 0)
                    break;

                b += 4;
                r += 4;
            }
        }
    } else {
        int save_dl = dl;
        while (c) {
            t = (a[0] + c) & BN_MASK2;
            c = (t < c);
            r[0] = t;
            if (--dl <= 0)
                break;

            t = (a[1] + c) & BN_MASK2;
            c = (t < c);
            r[1] = t;
            if (--dl <= 0)
                break;

            t = (a[2] + c) & BN_MASK2;
            c = (t < c);
            r[2] = t;
            if (--dl <= 0)
                break;

            t = (a[3] + c) & BN_MASK2;
            c = (t < c);
            r[3] = t;
            if (--dl <= 0)
                break;

            save_dl = dl;
            a += 4;
            r += 4;
        }
        if (dl > 0) {
            if (save_dl > dl) {
                switch (save_dl - dl) {
                case 1:
                    r[1] = a[1];
                    if (--dl <= 0)
                        break;
                case 2:
                    r[2] = a[2];
                    if (--dl <= 0)
                        break;
                case 3:
                    r[3] = a[3];
                    if (--dl <= 0)
                        break;
                }
                a += 4;
                r += 4;
            }
        }
        if (dl > 0) {
            for (;;) {
                r[0] = a[0];
                if (--dl <= 0)
                    break;
                r[1] = a[1];
                if (--dl <= 0)
                    break;
                r[2] = a[2];
                if (--dl <= 0)
                    break;
                r[3] = a[3];
                if (--dl <= 0)
                    break;

                a += 4;
                r += 4;
            }
        }
    }
    return c;
}